

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

_Bool tb_cmp(uc_struct_conflict15 *uc,void *ap,void *bp)

{
  if ((((*ap == *bp) && (*(int *)((long)ap + 4) == *(int *)((long)bp + 4))) &&
      (*(int *)((long)ap + 8) == *(int *)((long)bp + 8))) &&
     (((((*(uint *)((long)bp + 0x10) ^ *(uint *)((long)ap + 0x10)) & 0xff0affff) == 0 &&
       (*(int *)((long)ap + 0x14) == *(int *)((long)bp + 0x14))) &&
      (*(long *)((long)ap + 0x40) == *(long *)((long)bp + 0x40))))) {
    return *(long *)((long)ap + 0x48) == *(long *)((long)bp + 0x48);
  }
  return false;
}

Assistant:

static bool tb_cmp(struct uc_struct *uc, const void *ap, const void *bp)
{
    const TranslationBlock *a = ap;
    const TranslationBlock *b = bp;

    return a->pc == b->pc &&
        a->cs_base == b->cs_base &&
        a->flags == b->flags &&
        (tb_cflags(a) & CF_HASH_MASK) == (tb_cflags(b) & CF_HASH_MASK) &&
        a->trace_vcpu_dstate == b->trace_vcpu_dstate &&
        a->page_addr[0] == b->page_addr[0] &&
        a->page_addr[1] == b->page_addr[1];
}